

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContentSpecNode.cpp
# Opt level: O1

void __thiscall xercesc_4_0::ContentSpecNode::formatSpec(ContentSpecNode *this,XMLBuffer *bufToFill)

{
  ValueVectorOf<xercesc_4_0::formatNodeHolder> *pVVar1;
  ContentSpecNode *pCVar2;
  ContentSpecNode *pCVar3;
  XMLSize_t XVar4;
  bool bVar5;
  int iVar6;
  NodeTypes NVar7;
  undefined4 extraout_var;
  XMLSize_t XVar8;
  ContentSpecNode *pCVar9;
  XMLCh *chars;
  NodeTypes NVar10;
  formatNodeHolder fVar11;
  ValueStackOf<xercesc_4_0::formatNodeHolder> local_70;
  NodeTypes local_40;
  uint local_3c;
  ContentSpecNode *local_38;
  
  bufToFill->fIndex = 0;
  if (this->fType == Leaf) {
    if (bufToFill->fCapacity == 0) {
      XMLBuffer::ensureCapacity(bufToFill,1);
    }
    XVar8 = bufToFill->fIndex;
    bufToFill->fIndex = XVar8 + 1;
    bufToFill->fBuffer[XVar8] = L'(';
  }
  local_70.fVector.fMemoryManager = this->fMemoryManager;
  local_70.fVector.fCallDestructor = false;
  local_70.fVector.fCurCount = 0;
  local_70.fVector.fMaxCount = 10;
  local_70.fVector.fElemList = (formatNodeHolder *)0x0;
  iVar6 = (*(local_70.fVector.fMemoryManager)->_vptr_MemoryManager[3])();
  local_70.fVector.fElemList = (formatNodeHolder *)CONCAT44(extraout_var,iVar6);
  memset(local_70.fVector.fElemList,0,local_70.fVector.fMaxCount << 4);
  ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(&local_70.fVector,1);
  XVar8 = local_70.fVector.fCurCount + 1;
  local_70.fVector.fElemList[local_70.fVector.fCurCount].node = this;
  local_70.fVector.fElemList[local_70.fVector.fCurCount].parentType = UnknownType;
  local_70.fVector.fElemList[local_70.fVector.fCurCount].character = L'\0';
  local_70.fVector.fCurCount = XVar8;
  local_38 = this;
  if (XVar8 != 0) {
    local_3c = 0xffffffff;
    do {
      fVar11 = ValueStackOf<xercesc_4_0::formatNodeHolder>::pop(&local_70);
      pCVar9 = fVar11.node;
      if (fVar11.character != L'\0') {
        if (bufToFill->fIndex == bufToFill->fCapacity) {
          XMLBuffer::ensureCapacity(bufToFill,1);
        }
        XVar8 = bufToFill->fIndex;
        bufToFill->fIndex = XVar8 + 1;
        bufToFill->fBuffer[XVar8] = fVar11.character;
        goto switchD_002ef27a_caseD_6;
      }
      if (pCVar9 == (ContentSpecNode *)0x0) goto switchD_002ef27a_caseD_6;
      pCVar2 = pCVar9->fFirst;
      if (pCVar2 == (ContentSpecNode *)0x0) {
        NVar7 = Leaf;
      }
      else {
        NVar7 = pCVar2->fType;
      }
      NVar10 = fVar11.parentType;
      if (((NVar10 != UnknownType) && (NVar7 != Leaf)) ||
         ((bVar5 = false, NVar10 == UnknownType && (NVar7 == Leaf)))) {
        bVar5 = true;
      }
      local_40 = pCVar9->fType;
      if (9 < (uint)(local_40 & (Any_NS|Any_Other))) goto switchD_002ef27a_caseD_6;
      pCVar3 = pCVar9->fSecond;
      switch(local_40 & (Any_NS|Any_Other)) {
      case Leaf:
        if (pCVar9->fElement->fURIId == local_3c) {
          XMLBuffer::append(bufToFill,(XMLCh *)XMLElementDecl::fgPCDataElemName);
        }
        else {
          chars = QName::getRawName(pCVar9->fElement);
          XMLBuffer::append(bufToFill,chars);
          if (pCVar9->fMinOccurs == 1) {
            if (pCVar9->fMaxOccurs == -1 || 1 < pCVar9->fMaxOccurs) {
              if (bufToFill->fIndex == bufToFill->fCapacity) {
                XMLBuffer::ensureCapacity(bufToFill,1);
              }
              XVar8 = bufToFill->fIndex;
              bufToFill->fIndex = XVar8 + 1;
              bufToFill->fBuffer[XVar8] = L'+';
            }
          }
          else if (pCVar9->fMinOccurs == 0) {
            iVar6 = pCVar9->fMaxOccurs;
            if (iVar6 == -1 || 1 < iVar6) {
              if (bufToFill->fIndex == bufToFill->fCapacity) {
                XMLBuffer::ensureCapacity(bufToFill,1);
              }
              XVar8 = bufToFill->fIndex;
              bufToFill->fIndex = XVar8 + 1;
              bufToFill->fBuffer[XVar8] = L'*';
            }
            else if (iVar6 == 1) {
              if (bufToFill->fIndex == bufToFill->fCapacity) {
                XMLBuffer::ensureCapacity(bufToFill,1);
              }
              XVar8 = bufToFill->fIndex;
              bufToFill->fIndex = XVar8 + 1;
              bufToFill->fBuffer[XVar8] = L'?';
            }
          }
        }
        goto switchD_002ef27a_caseD_6;
      case ZeroOrOne:
        if (bVar5) {
          if (bufToFill->fIndex == bufToFill->fCapacity) {
            XMLBuffer::ensureCapacity(bufToFill,1);
          }
          XVar8 = bufToFill->fIndex;
          bufToFill->fIndex = XVar8 + 1;
          bufToFill->fBuffer[XVar8] = L'(';
        }
        pVVar1 = &local_70.fVector;
        ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(pVVar1,1);
        NVar7 = local_40;
        XVar8 = local_70.fVector.fCurCount + 1;
        local_70.fVector.fElemList[local_70.fVector.fCurCount].node = (ContentSpecNode *)0x0;
        local_70.fVector.fElemList[local_70.fVector.fCurCount].parentType = UnknownType;
        local_70.fVector.fElemList[local_70.fVector.fCurCount].character = L'?';
        local_70.fVector.fCurCount = XVar8;
        if (bVar5) {
          ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(pVVar1,1);
          local_70.fVector.fElemList[local_70.fVector.fCurCount].node = (ContentSpecNode *)0x0;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].parentType = UnknownType;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].character = L')';
          local_70.fVector.fCurCount = local_70.fVector.fCurCount + 1;
        }
        ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(pVVar1,1);
        break;
      case ZeroOrMore:
        if (bVar5) {
          if (bufToFill->fIndex == bufToFill->fCapacity) {
            XMLBuffer::ensureCapacity(bufToFill,1);
          }
          XVar8 = bufToFill->fIndex;
          bufToFill->fIndex = XVar8 + 1;
          bufToFill->fBuffer[XVar8] = L'(';
        }
        pVVar1 = &local_70.fVector;
        ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(pVVar1,1);
        NVar7 = local_40;
        XVar8 = local_70.fVector.fCurCount + 1;
        local_70.fVector.fElemList[local_70.fVector.fCurCount].node = (ContentSpecNode *)0x0;
        local_70.fVector.fElemList[local_70.fVector.fCurCount].parentType = UnknownType;
        local_70.fVector.fElemList[local_70.fVector.fCurCount].character = L'*';
        local_70.fVector.fCurCount = XVar8;
        if (bVar5) {
          ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(pVVar1,1);
          local_70.fVector.fElemList[local_70.fVector.fCurCount].node = (ContentSpecNode *)0x0;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].parentType = UnknownType;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].character = L')';
          local_70.fVector.fCurCount = local_70.fVector.fCurCount + 1;
        }
        ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(pVVar1,1);
        break;
      case OneOrMore:
        if (bVar5) {
          if (bufToFill->fIndex == bufToFill->fCapacity) {
            XMLBuffer::ensureCapacity(bufToFill,1);
          }
          XVar8 = bufToFill->fIndex;
          bufToFill->fIndex = XVar8 + 1;
          bufToFill->fBuffer[XVar8] = L'(';
        }
        pVVar1 = &local_70.fVector;
        ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(pVVar1,1);
        NVar7 = local_40;
        XVar8 = local_70.fVector.fCurCount + 1;
        local_70.fVector.fElemList[local_70.fVector.fCurCount].node = (ContentSpecNode *)0x0;
        local_70.fVector.fElemList[local_70.fVector.fCurCount].parentType = UnknownType;
        local_70.fVector.fElemList[local_70.fVector.fCurCount].character = L'+';
        local_70.fVector.fCurCount = XVar8;
        if (bVar5) {
          ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(pVVar1,1);
          local_70.fVector.fElemList[local_70.fVector.fCurCount].node = (ContentSpecNode *)0x0;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].parentType = UnknownType;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].character = L')';
          local_70.fVector.fCurCount = local_70.fVector.fCurCount + 1;
        }
        ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(pVVar1,1);
        break;
      case Choice:
        if ((NVar10 & (Any_NS|Any_Other)) != Choice) {
          if (bufToFill->fIndex == bufToFill->fCapacity) {
            XMLBuffer::ensureCapacity(bufToFill,1);
          }
          XVar8 = bufToFill->fIndex;
          bufToFill->fIndex = XVar8 + 1;
          bufToFill->fBuffer[XVar8] = L'(';
          ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(&local_70.fVector,1);
          local_70.fVector.fElemList[local_70.fVector.fCurCount].node = (ContentSpecNode *)0x0;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].parentType = UnknownType;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].character = L')';
          local_70.fVector.fCurCount = local_70.fVector.fCurCount + 1;
        }
        NVar7 = local_40;
        if (pCVar3 != (ContentSpecNode *)0x0) {
          ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(&local_70.fVector,1);
          local_70.fVector.fElemList[local_70.fVector.fCurCount].node = pCVar3;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].parentType = NVar7;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].character = L'\0';
          local_70.fVector.fCurCount = local_70.fVector.fCurCount + 1;
          ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(&local_70.fVector,1);
          local_70.fVector.fElemList[local_70.fVector.fCurCount].node = (ContentSpecNode *)0x0;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].parentType = UnknownType;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].character = L'|';
          local_70.fVector.fCurCount = local_70.fVector.fCurCount + 1;
        }
        ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(&local_70.fVector,1);
        break;
      case Sequence:
        if ((NVar10 & (Any_NS|Any_Other)) != Sequence) {
          if (bufToFill->fIndex == bufToFill->fCapacity) {
            XMLBuffer::ensureCapacity(bufToFill,1);
          }
          XVar8 = bufToFill->fIndex;
          bufToFill->fIndex = XVar8 + 1;
          bufToFill->fBuffer[XVar8] = L'(';
          ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(&local_70.fVector,1);
          local_70.fVector.fElemList[local_70.fVector.fCurCount].node = (ContentSpecNode *)0x0;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].parentType = UnknownType;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].character = L')';
          local_70.fVector.fCurCount = local_70.fVector.fCurCount + 1;
        }
        NVar7 = local_40;
        if (pCVar3 != (ContentSpecNode *)0x0) {
          ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(&local_70.fVector,1);
          local_70.fVector.fElemList[local_70.fVector.fCurCount].node = pCVar3;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].parentType = NVar7;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].character = L'\0';
          local_70.fVector.fCurCount = local_70.fVector.fCurCount + 1;
          ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(&local_70.fVector,1);
          local_70.fVector.fElemList[local_70.fVector.fCurCount].node = (ContentSpecNode *)0x0;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].parentType = UnknownType;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].character = L',';
          local_70.fVector.fCurCount = local_70.fVector.fCurCount + 1;
        }
        ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(&local_70.fVector,1);
        break;
      default:
        goto switchD_002ef27a_caseD_6;
      case All:
        if ((NVar10 & (Any_NS|Any_Other)) != All) {
          if (bufToFill->fIndex == bufToFill->fCapacity) {
            XMLBuffer::ensureCapacity(bufToFill,1);
          }
          XVar4 = bufToFill->fIndex;
          XVar8 = XVar4 + 1;
          bufToFill->fIndex = XVar8;
          bufToFill->fBuffer[XVar4] = L'A';
          if (XVar8 == bufToFill->fCapacity) {
            XMLBuffer::ensureCapacity(bufToFill,1);
          }
          XVar4 = bufToFill->fIndex;
          XVar8 = XVar4 + 1;
          bufToFill->fIndex = XVar8;
          bufToFill->fBuffer[XVar4] = L'l';
          if (XVar8 == bufToFill->fCapacity) {
            XMLBuffer::ensureCapacity(bufToFill,1);
          }
          XVar4 = bufToFill->fIndex;
          XVar8 = XVar4 + 1;
          bufToFill->fIndex = XVar8;
          bufToFill->fBuffer[XVar4] = L'l';
          if (XVar8 == bufToFill->fCapacity) {
            XMLBuffer::ensureCapacity(bufToFill,1);
          }
          XVar8 = bufToFill->fIndex;
          bufToFill->fIndex = XVar8 + 1;
          bufToFill->fBuffer[XVar8] = L'(';
          ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(&local_70.fVector,1);
          local_70.fVector.fElemList[local_70.fVector.fCurCount].node = (ContentSpecNode *)0x0;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].parentType = UnknownType;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].character = L')';
          local_70.fVector.fCurCount = local_70.fVector.fCurCount + 1;
        }
        pVVar1 = &local_70.fVector;
        ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(pVVar1,1);
        NVar7 = local_40;
        local_70.fVector.fElemList[local_70.fVector.fCurCount].node = pCVar3;
        local_70.fVector.fElemList[local_70.fVector.fCurCount].parentType = local_40;
        local_70.fVector.fElemList[local_70.fVector.fCurCount].character = L'\0';
        local_70.fVector.fCurCount = local_70.fVector.fCurCount + 1;
        ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(pVVar1,1);
        local_70.fVector.fElemList[local_70.fVector.fCurCount].node = (ContentSpecNode *)0x0;
        local_70.fVector.fElemList[local_70.fVector.fCurCount].parentType = UnknownType;
        local_70.fVector.fElemList[local_70.fVector.fCurCount].character = L',';
        local_70.fVector.fCurCount = local_70.fVector.fCurCount + 1;
        ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(pVVar1,1);
      }
      local_70.fVector.fElemList[local_70.fVector.fCurCount].node = pCVar2;
      local_70.fVector.fElemList[local_70.fVector.fCurCount].parentType = NVar7;
      local_70.fVector.fElemList[local_70.fVector.fCurCount].character = L'\0';
      local_70.fVector.fCurCount = local_70.fVector.fCurCount + 1;
switchD_002ef27a_caseD_6:
    } while (local_70.fVector.fCurCount != 0);
  }
  (*(local_70.fVector.fMemoryManager)->_vptr_MemoryManager[4])
            (local_70.fVector.fMemoryManager,local_70.fVector.fElemList);
  if (local_38->fType == Leaf) {
    if (bufToFill->fIndex == bufToFill->fCapacity) {
      XMLBuffer::ensureCapacity(bufToFill,1);
    }
    XVar8 = bufToFill->fIndex;
    bufToFill->fIndex = XVar8 + 1;
    bufToFill->fBuffer[XVar8] = L')';
  }
  return;
}

Assistant:

void ContentSpecNode::formatSpec(XMLBuffer&      bufToFill) const
{
    // Clean out the buffer first
    bufToFill.reset();

    if (fType == ContentSpecNode::Leaf)
        bufToFill.append(chOpenParen);
    formatNode
    (
        this
		, bufToFill
        , fMemoryManager
    );
    if (fType == ContentSpecNode::Leaf)
        bufToFill.append(chCloseParen);
}